

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O1

string * __thiscall
EncryptionHelper::EncryptString
          (string *__return_storage_ptr__,EncryptionHelper *this,string *inStringToEncrypt)

{
  pointer pcVar1;
  bool inIsUsingAES;
  ByteList *inEncryptionKey;
  IByteWriter *inOutputStream;
  EncryptionHelper *this_00;
  OutputStreamTraits traits;
  OutputStringBufferStream buffer;
  InputStringStream inputStream;
  OutputStreamTraits local_60;
  OutputStringBufferStream local_58;
  InputStringStream local_40;
  
  if (((this->mIsDocumentEncrypted == true) && (this->mEncryptionPauseLevel == 0)) &&
     (this->mXcryptStrings != (XCryptionCommon *)0x0)) {
    OutputStringBufferStream::OutputStringBufferStream(&local_58);
    inEncryptionKey = XCryptionCommon::GetCurrentObjectKey_abi_cxx11_(this->mXcryptStrings);
    this_00 = (EncryptionHelper *)this->mXcryptStrings;
    inIsUsingAES = XCryptionCommon::IsUsingAES((XCryptionCommon *)this_00);
    inOutputStream =
         &CreateEncryptionWriter
                    (this_00,&local_58.super_IByteWriterWithPosition,inEncryptionKey,inIsUsingAES)->
          super_IByteWriter;
    InputStringStream::InputStringStream(&local_40,inStringToEncrypt);
    OutputStreamTraits::OutputStreamTraits(&local_60,inOutputStream);
    OutputStreamTraits::CopyToOutputStream(&local_60,(IByteReader *)&local_40);
    (*inOutputStream->_vptr_IByteWriter[1])(inOutputStream);
    OutputStringBufferStream::ToString_abi_cxx11_(__return_storage_ptr__,&local_58);
    OutputStreamTraits::~OutputStreamTraits(&local_60);
    InputStringStream::~InputStringStream(&local_40);
    OutputStringBufferStream::~OutputStringBufferStream(&local_58);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (inStringToEncrypt->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + inStringToEncrypt->_M_string_length)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EncryptionHelper::EncryptString(const std::string& inStringToEncrypt) {
	if (!IsEncrypting() || !mXcryptStrings)
		return inStringToEncrypt;

	OutputStringBufferStream buffer;

	IByteWriterWithPosition* encryptStream = CreateEncryptionWriter(&buffer, mXcryptStrings->GetCurrentObjectKey(), mXcryptStrings->IsUsingAES());
	if (encryptStream) {
		InputStringStream inputStream(inStringToEncrypt);
		OutputStreamTraits traits(encryptStream);
		traits.CopyToOutputStream(&inputStream);
		delete encryptStream; // free encryption stream (sometimes it will also mean flushing the output stream)

		return buffer.ToString();
	}
	else
		return inStringToEncrypt;
}